

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__include
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  long *in_RSI;
  ParserTemplateBase *in_RDI;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  include__AttributeData *attributeData;
  URI *in_stack_fffffffffffffda8;
  URI *other;
  URI *in_stack_fffffffffffffdb0;
  void **in_stack_fffffffffffffdb8;
  StringHash in_stack_fffffffffffffdc8;
  bool *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  StringHash in_stack_fffffffffffffea8;
  ErrorType in_stack_fffffffffffffeb0;
  Severity in_stack_fffffffffffffeb4;
  ParserTemplateBase *in_stack_fffffffffffffeb8;
  URI local_140;
  byte local_51;
  ParserChar *local_50;
  StringHash local_48;
  ParserChar *local_40;
  undefined8 *local_38;
  include__AttributeData *local_30;
  long *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_30 = GeneratedSaxParser::ParserTemplateBase::
             newData<COLLADASaxFWL14::include__AttributeData>(in_RDI,in_stack_fffffffffffffdb8);
  local_38 = (undefined8 *)*local_18;
  if (local_38 == (undefined8 *)0x0) {
LAB_00889b55:
    if ((local_30->present_attributes & 1) == 0) {
      other = (URI *)&stack0xfffffffffffffdc8;
      COLLADABU::URI::URI((URI *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
      COLLADABU::URI::operator=(in_stack_fffffffffffffdb0,other);
      COLLADABU::URI::~URI(in_stack_fffffffffffffdb0);
    }
    if ((local_30->sid == (ParserChar *)0x0) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc
                           ,in_stack_fffffffffffffdd8,(StringHash)in_stack_fffffffffffffdd0,
                           in_stack_fffffffffffffdc8,(ParserChar *)in_RDI), bVar1)) {
      local_1 = false;
    }
    else if (((local_30->present_attributes & 1) == 0) &&
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               ((ParserTemplateBase *)in_stack_fffffffffffffde0,
                                in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                                (StringHash)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                                (ParserChar *)in_RDI), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        while( true ) {
          local_40 = (ParserChar *)*local_38;
          if (local_40 == (ParserChar *)0x0) {
            local_40 = (ParserChar *)0x0;
            goto LAB_00889b55;
          }
          local_48 = GeneratedSaxParser::Utils::calculateStringHash(local_40);
          if (local_38 + 1 == (undefined8 *)0x0) {
            return false;
          }
          local_50 = (ParserChar *)local_38[1];
          local_38 = local_38 + 2;
          if (local_48 != 0x79f4) break;
          local_30->sid = local_50;
        }
        if (local_48 != 0x7c8c) break;
        in_stack_fffffffffffffdb0 = &local_140;
        GeneratedSaxParser::Utils::toURI
                  ((ParserChar **)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   in_stack_fffffffffffffdd0);
        COLLADABU::URI::operator=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        COLLADABU::URI::~URI(in_stack_fffffffffffffdb0);
        if (((local_51 & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)in_stack_fffffffffffffde0,
                               in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                               (StringHash)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                               (ParserChar *)in_RDI), bVar1)) {
          return false;
        }
        if ((local_51 & 1) == 0) {
          local_30->present_attributes = local_30->present_attributes | 1;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         (ParserChar *)in_stack_fffffffffffffea0,
                         (ParserChar *)in_stack_fffffffffffffe98);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__include( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__include( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

include__AttributeData* attributeData = newData<include__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_sid:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INCLUDE,
            HASH_ATTRIBUTE_sid,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_url:
    {
bool failed;
attributeData->url = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INCLUDE,
        HASH_ATTRIBUTE_url,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= include__AttributeData::ATTRIBUTE_URL_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_INCLUDE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & include__AttributeData::ATTRIBUTE_URL_PRESENT) == 0)
{
    attributeData->url = COLLADABU::URI("");
}
if ( !attributeData->sid )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INCLUDE, HASH_ATTRIBUTE_sid, 0 ) )
        return false;
}
if ( (attributeData->present_attributes & include__AttributeData::ATTRIBUTE_URL_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INCLUDE, HASH_ATTRIBUTE_url, 0 ) )
        return false;
}


    return true;
}